

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void store_memop(void *haddr,uint64_t val,MemOp op)

{
  uint uVar1;
  
  switch(op) {
  case MO_8:
    *(char *)haddr = (char)val;
    return;
  case MO_BEUW:
    val = (uint64_t)(ushort)((ushort)val << 8 | (ushort)val >> 8);
  case MO_16:
    *(short *)haddr = (short)val;
    return;
  case MO_BEUL:
    uVar1 = (uint)val;
    val = (uint64_t)
          (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  case MO_32:
    *(int *)haddr = (int)val;
    return;
  case MO_BEQ:
    val = val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
          (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
          (val & 0xff00) << 0x28 | val << 0x38;
  case MO_64:
    *(uint64_t *)haddr = val;
  default:
    return;
  }
}

Assistant:

static void inline
store_memop(void *haddr, uint64_t val, MemOp op)
{
    switch (op) {
    case MO_UB:
        stb_p(haddr, val);
        break;
    case MO_BEUW:
        stw_be_p(haddr, val);
        break;
    case MO_LEUW:
        stw_le_p(haddr, val);
        break;
    case MO_BEUL:
        stl_be_p(haddr, val);
        break;
    case MO_LEUL:
        stl_le_p(haddr, val);
        break;
    case MO_BEQ:
        stq_be_p(haddr, val);
        break;
    case MO_LEQ:
        stq_le_p(haddr, val);
        break;
    default:
        // qemu_build_not_reached();
        break;
    }
}